

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryCopy(Replacer *this,MemoryCopy *curr)

{
  string_view memory;
  Index index;
  Index sizeIdx_00;
  Function *pFVar1;
  LocalSet *localSet;
  Expression *pEVar2;
  LocalGet *pLVar3;
  Index sizeIdx;
  Index sourceIdx;
  MemoryCopy *curr_local;
  Replacer *this_local;
  
  if ((this->parent->checkBounds & 1U) == 0) {
    pEVar2 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)(curr->destMemory).super_IString.str,0xffffffff,
                        (Expression *)0x0,(Expression *)0x0);
    curr->dest = pEVar2;
    pEVar2 = getSource(this,curr,0xffffffff,0xffffffff);
    curr->source = pEVar2;
  }
  else {
    pFVar1 = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
             ::getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          );
    index = Builder::addVar(pFVar1,(Type)(this->parent->pointerType).id);
    pFVar1 = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
             ::getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          );
    sizeIdx_00 = Builder::addVar(pFVar1,(Type)(this->parent->pointerType).id);
    memory = (curr->destMemory).super_IString.str;
    localSet = Builder::makeLocalSet(&this->builder,index,curr->source);
    pEVar2 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)memory,sizeIdx_00,(Expression *)localSet,(Expression *)0x0);
    curr->dest = pEVar2;
    pEVar2 = getSource(this,curr,sizeIdx_00,index);
    curr->source = pEVar2;
    pLVar3 = Builder::makeLocalGet(&this->builder,sizeIdx_00,(Type)(this->parent->pointerType).id);
    curr->size = (Expression *)pLVar3;
  }
  wasm::Name::operator=(&curr->destMemory,&this->parent->combinedMemory);
  wasm::Name::operator=(&curr->sourceMemory,&this->parent->combinedMemory);
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
      if (parent.checkBounds) {
        Index sourceIdx = Builder::addVar(getFunction(), parent.pointerType);
        Index sizeIdx = Builder::addVar(getFunction(), parent.pointerType);
        curr->dest = getDest(curr,
                             curr->destMemory,
                             sizeIdx,
                             builder.makeLocalSet(sourceIdx, curr->source));
        curr->source = getSource(curr, sizeIdx, sourceIdx);
        curr->size = builder.makeLocalGet(sizeIdx, parent.pointerType);
      } else {
        curr->dest = getDest(curr, curr->destMemory);
        curr->source = getSource(curr);
      }
      curr->destMemory = parent.combinedMemory;
      curr->sourceMemory = parent.combinedMemory;
    }